

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

bool __thiscall
Lib::
DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::insert(DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
        AbstractOptionValue *val)

{
  Entry *pEVar1;
  AbstractOptionValue *in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *unaff_R14;
  bool bVar2;
  bool exists;
  Entry *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  
  key_00 = in_RDI;
  ensureExpanded((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)0x76eda6);
  pEVar1 = findEntryToInsert(unaff_R14,key_00);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == *(uint *)&(in_RDI->_M_dataplus)._M_p) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if (!bVar2) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == *(uint *)&(in_RDI->_M_dataplus)._M_p) {
      *(int *)&in_RDI->_M_string_length = (int)in_RDI->_M_string_length + -1;
    }
    else {
      (pEVar1->field_0)._infoData =
           (pEVar1->field_0)._infoData & 3U | *(int *)&(in_RDI->_M_dataplus)._M_p << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    std::__cxx11::string::operator=((string *)&pEVar1->_key,in_RSI);
    pEVar1->_val = in_RDX;
    *(int *)((long)&(in_RDI->_M_dataplus)._M_p + 4) =
         *(int *)((long)&(in_RDI->_M_dataplus)._M_p + 4) + 1;
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }